

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_handler.cc
# Opt level: O0

shared_ptr<JSONHandler> make_all_handler(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  __shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDI;
  shared_ptr<JSONHandler> sVar4;
  shared_ptr<JSONHandler> local_5e8;
  allocator<char> local_5d1;
  string local_5d0;
  string_handler_t local_5b0;
  shared_ptr<JSONHandler> local_590;
  allocator<char> local_579;
  string local_578;
  shared_ptr<JSONHandler> local_558;
  json_handler_t local_548;
  undefined1 local_528 [8];
  shared_ptr<JSONHandler> h6ax;
  allocator<char> local_501;
  string local_500;
  undefined1 local_4e0 [8];
  shared_ptr<JSONHandler> h6ab;
  string local_4c8;
  void_handler_t local_4a8;
  json_handler_t local_488;
  shared_ptr<JSONHandler> local_468;
  allocator<char> local_451;
  string local_450;
  undefined1 local_430 [8];
  shared_ptr<JSONHandler> h6a;
  string local_418;
  void_handler_t local_3f8;
  json_handler_t local_3d8;
  undefined1 local_3b8 [8];
  shared_ptr<JSONHandler> h6;
  shared_ptr<JSONHandler> local_398;
  allocator<char> local_381;
  string local_380;
  void_handler_t local_360;
  json_handler_t local_340;
  shared_ptr<JSONHandler> local_320;
  allocator<char> local_309;
  string local_308;
  undefined1 local_2e8 [8];
  shared_ptr<JSONHandler> h5s;
  string_handler_t local_2b8;
  bool_handler_t local_298;
  undefined1 local_278 [8];
  shared_ptr<JSONHandler> h5;
  allocator<char> local_251;
  string local_250;
  shared_ptr<JSONHandler> local_230;
  allocator<char> local_219;
  string local_218;
  json_handler_t local_1f8;
  undefined1 local_1d8 [8];
  shared_ptr<JSONHandler> h4;
  allocator<char> local_1b1;
  string local_1b0;
  bool_handler_t local_190;
  undefined1 local_170 [8];
  shared_ptr<JSONHandler> h3;
  allocator<char> local_149;
  string local_148;
  string_handler_t local_128;
  undefined1 local_108 [8];
  shared_ptr<JSONHandler> h2;
  allocator<char> local_e1;
  string local_e0;
  string_handler_t local_c0;
  undefined1 local_a0 [8];
  shared_ptr<JSONHandler> h1;
  allocator<char> local_79;
  string local_78;
  void_handler_t local_58;
  json_handler_t local_38;
  byte local_11;
  shared_ptr<JSONHandler> *h;
  
  local_11 = 0;
  std::make_shared<JSONHandler>();
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDI);
  std::function<void(std::__cxx11::string_const&,JSON)>::
  function<void(&)(std::__cxx11::string_const&,JSON),void>
            ((function<void(std::__cxx11::string_const&,JSON)> *)&local_38,print_json);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"dict end",&local_79);
  make_print_message(&local_58,&local_78);
  JSONHandler::addDictHandlers(peVar2,&local_38,&local_58);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
  ::~function(&local_38);
  std::make_shared<JSONHandler>();
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_a0);
  std::function<void(std::__cxx11::string_const&,std::__cxx11::string_const&)>::
  function<void(&)(std::__cxx11::string_const&,std::__cxx11::string_const&),void>
            ((function<void(std::__cxx11::string_const&,std::__cxx11::string_const&)> *)&local_c0,
             print_string);
  JSONHandler::addStringHandler(peVar2,&local_c0);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_c0);
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"one",&local_e1);
  p_Var1 = &h2.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<JSONHandler>::shared_ptr
            ((shared_ptr<JSONHandler> *)p_Var1,(shared_ptr<JSONHandler> *)local_a0);
  JSONHandler::addDictKeyHandler(peVar2,&local_e0,(shared_ptr<JSONHandler> *)p_Var1);
  std::shared_ptr<JSONHandler>::~shared_ptr
            ((shared_ptr<JSONHandler> *)
             &h2.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::make_shared<JSONHandler>();
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_108);
  std::function<void(std::__cxx11::string_const&,std::__cxx11::string_const&)>::
  function<void(&)(std::__cxx11::string_const&,std::__cxx11::string_const&),void>
            ((function<void(std::__cxx11::string_const&,std::__cxx11::string_const&)> *)&local_128,
             print_number);
  JSONHandler::addNumberHandler(peVar2,&local_128);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_128);
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"two",&local_149);
  p_Var1 = &h3.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<JSONHandler>::shared_ptr
            ((shared_ptr<JSONHandler> *)p_Var1,(shared_ptr<JSONHandler> *)local_108);
  JSONHandler::addDictKeyHandler(peVar2,&local_148,(shared_ptr<JSONHandler> *)p_Var1);
  std::shared_ptr<JSONHandler>::~shared_ptr
            ((shared_ptr<JSONHandler> *)
             &h3.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::make_shared<JSONHandler>();
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_170);
  std::function<void(std::__cxx11::string_const&,bool)>::
  function<void(&)(std::__cxx11::string_const&,bool),void>
            ((function<void(std::__cxx11::string_const&,bool)> *)&local_190,print_bool);
  JSONHandler::addBoolHandler(peVar2,&local_190);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::~function(&local_190);
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"three",&local_1b1);
  p_Var1 = &h4.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<JSONHandler>::shared_ptr
            ((shared_ptr<JSONHandler> *)p_Var1,(shared_ptr<JSONHandler> *)local_170);
  JSONHandler::addDictKeyHandler(peVar2,&local_1b0,(shared_ptr<JSONHandler> *)p_Var1);
  std::shared_ptr<JSONHandler>::~shared_ptr
            ((shared_ptr<JSONHandler> *)
             &h4.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::make_shared<JSONHandler>();
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_1d8);
  std::function<void(std::__cxx11::string_const&,JSON)>::
  function<void(&)(std::__cxx11::string_const&,JSON),void>
            ((function<void(std::__cxx11::string_const&,JSON)> *)&local_1f8,print_json);
  JSONHandler::addAnyHandler(peVar2,&local_1f8);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
  ::~function(&local_1f8);
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"four",&local_219);
  std::shared_ptr<JSONHandler>::shared_ptr(&local_230,(shared_ptr<JSONHandler> *)local_1d8);
  JSONHandler::addDictKeyHandler(peVar2,&local_218,&local_230);
  std::shared_ptr<JSONHandler>::~shared_ptr(&local_230);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"phour",&local_251);
  p_Var1 = &h5.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<JSONHandler>::shared_ptr
            ((shared_ptr<JSONHandler> *)p_Var1,(shared_ptr<JSONHandler> *)local_1d8);
  JSONHandler::addDictKeyHandler(peVar2,&local_250,(shared_ptr<JSONHandler> *)p_Var1);
  std::shared_ptr<JSONHandler>::~shared_ptr
            ((shared_ptr<JSONHandler> *)
             &h5.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  std::make_shared<JSONHandler>();
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_278);
  std::function<void(std::__cxx11::string_const&,bool)>::
  function<void(&)(std::__cxx11::string_const&,bool),void>
            ((function<void(std::__cxx11::string_const&,bool)> *)&local_298,print_bool);
  JSONHandler::addBoolHandler(peVar2,&local_298);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::~function(&local_298);
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_278);
  std::function<void(std::__cxx11::string_const&,std::__cxx11::string_const&)>::
  function<void(&)(std::__cxx11::string_const&,std::__cxx11::string_const&),void>
            ((function<void(std::__cxx11::string_const&,std::__cxx11::string_const&)> *)&local_2b8,
             print_string);
  JSONHandler::addStringHandler(peVar2,&local_2b8);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2b8);
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_278);
  p_Var1 = &h5s.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::function<void(std::__cxx11::string_const&)>::
  function<void(&)(std::__cxx11::string_const&),void>
            ((function<void(std::__cxx11::string_const&)> *)p_Var1,print_null);
  JSONHandler::addNullHandler(peVar2,(void_handler_t *)p_Var1);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)&h5s.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<JSONHandler>();
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"five",&local_309);
  std::shared_ptr<JSONHandler>::shared_ptr(&local_320,(shared_ptr<JSONHandler> *)local_2e8);
  JSONHandler::addDictKeyHandler(peVar2,&local_308,&local_320);
  std::shared_ptr<JSONHandler>::~shared_ptr(&local_320);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator(&local_309);
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_2e8);
  std::function<void(std::__cxx11::string_const&,JSON)>::
  function<void(&)(std::__cxx11::string_const&,JSON),void>
            ((function<void(std::__cxx11::string_const&,JSON)> *)&local_340,print_json);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"array end",&local_381);
  make_print_message(&local_360,&local_380);
  std::shared_ptr<JSONHandler>::shared_ptr(&local_398,(shared_ptr<JSONHandler> *)local_278);
  JSONHandler::addArrayHandlers(peVar2,&local_340,&local_360,&local_398);
  std::shared_ptr<JSONHandler>::~shared_ptr(&local_398);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator(&local_381);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
  ::~function(&local_340);
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_2e8);
  p_Var1 = &h6.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<JSONHandler>::shared_ptr
            ((shared_ptr<JSONHandler> *)p_Var1,(shared_ptr<JSONHandler> *)local_278);
  JSONHandler::addFallbackHandler(peVar2,(shared_ptr<JSONHandler> *)p_Var1);
  std::shared_ptr<JSONHandler>::~shared_ptr
            ((shared_ptr<JSONHandler> *)
             &h6.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<JSONHandler>();
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_3b8);
  std::function<void(std::__cxx11::string_const&,JSON)>::
  function<void(&)(std::__cxx11::string_const&,JSON),void>
            ((function<void(std::__cxx11::string_const&,JSON)> *)&local_3d8,print_json);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,"dict end",
             (allocator<char> *)
             ((long)&h6a.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  make_print_message(&local_3f8,&local_418);
  JSONHandler::addDictHandlers(peVar2,&local_3d8,&local_3f8);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_3f8);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&h6a.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
  ::~function(&local_3d8);
  std::make_shared<JSONHandler>();
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"a",&local_451);
  std::shared_ptr<JSONHandler>::shared_ptr(&local_468,(shared_ptr<JSONHandler> *)local_430);
  JSONHandler::addDictKeyHandler(peVar2,&local_450,&local_468);
  std::shared_ptr<JSONHandler>::~shared_ptr(&local_468);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_430);
  std::function<void(std::__cxx11::string_const&,JSON)>::
  function<void(&)(std::__cxx11::string_const&,JSON),void>
            ((function<void(std::__cxx11::string_const&,JSON)> *)&local_488,print_json);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"dict end",
             (allocator<char> *)
             ((long)&h6ab.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  make_print_message(&local_4a8,&local_4c8);
  JSONHandler::addDictHandlers(peVar2,&local_488,&local_4a8);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_4a8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&h6ab.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
  ::~function(&local_488);
  std::make_shared<JSONHandler>();
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_430);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"b",&local_501);
  p_Var1 = &h6ax.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<JSONHandler>::shared_ptr
            ((shared_ptr<JSONHandler> *)p_Var1,(shared_ptr<JSONHandler> *)local_4e0);
  JSONHandler::addDictKeyHandler(peVar2,&local_500,(shared_ptr<JSONHandler> *)p_Var1);
  std::shared_ptr<JSONHandler>::~shared_ptr
            ((shared_ptr<JSONHandler> *)
             &h6ax.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator(&local_501);
  std::make_shared<JSONHandler>();
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_528);
  std::function<void(std::__cxx11::string_const&,JSON)>::
  function<void(&)(std::__cxx11::string_const&,JSON),void>
            ((function<void(std::__cxx11::string_const&,JSON)> *)&local_548,print_json);
  JSONHandler::addAnyHandler(peVar2,&local_548);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
  ::~function(&local_548);
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_430);
  std::shared_ptr<JSONHandler>::shared_ptr(&local_558,(shared_ptr<JSONHandler> *)local_528);
  JSONHandler::addFallbackDictHandler(peVar2,&local_558);
  std::shared_ptr<JSONHandler>::~shared_ptr(&local_558);
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"b",&local_579);
  std::shared_ptr<JSONHandler>::shared_ptr(&local_590,(shared_ptr<JSONHandler> *)local_4e0);
  JSONHandler::addDictKeyHandler(peVar2,&local_578,&local_590);
  std::shared_ptr<JSONHandler>::~shared_ptr(&local_590);
  std::__cxx11::string::~string((string *)&local_578);
  std::allocator<char>::~allocator(&local_579);
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_4e0);
  std::function<void(std::__cxx11::string_const&,std::__cxx11::string_const&)>::
  function<void(&)(std::__cxx11::string_const&,std::__cxx11::string_const&),void>
            ((function<void(std::__cxx11::string_const&,std::__cxx11::string_const&)> *)&local_5b0,
             print_string);
  JSONHandler::addStringHandler(peVar2,&local_5b0);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_5b0);
  peVar2 = std::__shared_ptr_access<JSONHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d0,"six",&local_5d1);
  std::shared_ptr<JSONHandler>::shared_ptr(&local_5e8,(shared_ptr<JSONHandler> *)local_3b8);
  JSONHandler::addDictKeyHandler(peVar2,&local_5d0,&local_5e8);
  std::shared_ptr<JSONHandler>::~shared_ptr(&local_5e8);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  local_11 = 1;
  std::shared_ptr<JSONHandler>::~shared_ptr((shared_ptr<JSONHandler> *)local_528);
  std::shared_ptr<JSONHandler>::~shared_ptr((shared_ptr<JSONHandler> *)local_4e0);
  std::shared_ptr<JSONHandler>::~shared_ptr((shared_ptr<JSONHandler> *)local_430);
  std::shared_ptr<JSONHandler>::~shared_ptr((shared_ptr<JSONHandler> *)local_3b8);
  std::shared_ptr<JSONHandler>::~shared_ptr((shared_ptr<JSONHandler> *)local_2e8);
  std::shared_ptr<JSONHandler>::~shared_ptr((shared_ptr<JSONHandler> *)local_278);
  std::shared_ptr<JSONHandler>::~shared_ptr((shared_ptr<JSONHandler> *)local_1d8);
  std::shared_ptr<JSONHandler>::~shared_ptr((shared_ptr<JSONHandler> *)local_170);
  std::shared_ptr<JSONHandler>::~shared_ptr((shared_ptr<JSONHandler> *)local_108);
  std::shared_ptr<JSONHandler>::~shared_ptr((shared_ptr<JSONHandler> *)local_a0);
  _Var3._M_pi = extraout_RDX;
  if ((local_11 & 1) == 0) {
    std::shared_ptr<JSONHandler>::~shared_ptr((shared_ptr<JSONHandler> *)in_RDI);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)in_RDI;
  return (shared_ptr<JSONHandler>)sVar4.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<JSONHandler>
make_all_handler()
{
    auto h = std::make_shared<JSONHandler>();
    h->addDictHandlers(print_json, make_print_message("dict end"));
    auto h1 = std::make_shared<JSONHandler>();
    h1->addStringHandler(print_string);
    h->addDictKeyHandler("one", h1);
    auto h2 = std::make_shared<JSONHandler>();
    h2->addNumberHandler(print_number);
    h->addDictKeyHandler("two", h2);
    auto h3 = std::make_shared<JSONHandler>();
    h3->addBoolHandler(print_bool);
    h->addDictKeyHandler("three", h3);
    auto h4 = std::make_shared<JSONHandler>();
    h4->addAnyHandler(print_json);
    h->addDictKeyHandler("four", h4);
    h->addDictKeyHandler("phour", h4); // share h4
    auto h5 = std::make_shared<JSONHandler>();
    // Allow to be either string or bool
    h5->addBoolHandler(print_bool);
    h5->addStringHandler(print_string);
    h5->addNullHandler(print_null);
    auto h5s = std::make_shared<JSONHandler>();
    h->addDictKeyHandler("five", h5s);
    h5s->addArrayHandlers(print_json, make_print_message("array end"), h5);
    h5s->addFallbackHandler(h5);
    auto h6 = std::make_shared<JSONHandler>();
    h6->addDictHandlers(print_json, make_print_message("dict end"));
    auto h6a = std::make_shared<JSONHandler>();
    h6->addDictKeyHandler("a", h6a);
    h6a->addDictHandlers(print_json, make_print_message("dict end"));
    auto h6ab = std::make_shared<JSONHandler>();
    h6a->addDictKeyHandler("b", h6ab);
    auto h6ax = std::make_shared<JSONHandler>();
    h6ax->addAnyHandler(print_json);
    h6a->addFallbackDictHandler(h6ax);
    h6->addDictKeyHandler("b", h6ab); // share
    h6ab->addStringHandler(print_string);
    h->addDictKeyHandler("six", h6);
    return h;
}